

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O0

size_type __thiscall
lf::uscalfe::FeLagrangeO1Segment<double>::NumRefShapeFunctions
          (FeLagrangeO1Segment<double> *this,dim_t codim,sub_idx_t subidx)

{
  ostream *this_00;
  allocator<char> local_501;
  string local_500;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  string local_4b0;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  stringstream local_420 [8];
  stringstream ss_1;
  ostream local_410 [383];
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  sub_idx_t local_18;
  dim_t local_14;
  sub_idx_t subidx_local;
  dim_t codim_local;
  FeLagrangeO1Segment<double> *this_local;
  
  local_18 = subidx;
  local_14 = codim;
  _subidx_local = this;
  if (1 < codim) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    this_00 = std::operator<<(local_190,"Illegal codim ");
    std::ostream::operator<<(this_00,local_14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"codim <= 1",&local_1d1)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_1f9);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_1d0,&local_1f8,0x142,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_240,"false",&local_241);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_268,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_269);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,"",&local_291);
    lf::base::AssertionFailed(&local_240,&local_268,0x142,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator(&local_241);
    abort();
  }
  if (((codim != 1) || (1 < subidx)) && ((codim != 0 || (subidx != 0)))) {
    std::__cxx11::stringstream::stringstream(local_420);
    std::operator<<(local_410,"codim/subidx out of range.");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"(codim == 1 && subidx < 2) || (codim == 0 && subidx == 0)",
               &local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_468,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_469);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_440,&local_468,0x144,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::__cxx11::string::~string((string *)&local_468);
    std::allocator<char>::~allocator(&local_469);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"false",&local_4b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4d8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
               ,&local_4d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_500,"",&local_501);
    lf::base::AssertionFailed(&local_4b0,&local_4d8,0x144,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::allocator<char>::~allocator(&local_501);
    std::__cxx11::string::~string((string *)&local_4d8);
    std::allocator<char>::~allocator(&local_4d9);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    abort();
  }
  return (uint)(codim == 1);
}

Assistant:

[[nodiscard]] size_type NumRefShapeFunctions(
      dim_t codim, sub_idx_t subidx) const override {
    LF_ASSERT_MSG(codim <= 1, "Illegal codim " << codim);
    LF_ASSERT_MSG((codim == 1 && subidx < 2) || (codim == 0 && subidx == 0),
                  "codim/subidx out of range.");
    return (codim == 1) ? 1 : 0;
  }